

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void UpdateCostAtIndex(CostManager *manager,int i,int do_clean_intervals)

{
  int iVar1;
  CostInterval *pCVar2;
  CostInterval *interval;
  
  pCVar2 = manager->head;
  while ((interval = pCVar2, interval != (CostInterval *)0x0 && (interval->start <= i))) {
    pCVar2 = interval->next;
    if (i < interval->end) {
      if (interval->cost < manager->costs[i]) {
        iVar1 = interval->index;
        manager->costs[i] = interval->cost;
        manager->dist_array[i] = ((short)i - (short)iVar1) + 1;
      }
    }
    else if (do_clean_intervals != 0) {
      PopInterval(manager,interval);
    }
  }
  return;
}

Assistant:

static WEBP_INLINE void UpdateCostAtIndex(CostManager* const manager, int i,
                                          int do_clean_intervals) {
  CostInterval* current = manager->head;

  while (current != NULL && current->start <= i) {
    CostInterval* const next = current->next;
    if (current->end <= i) {
      if (do_clean_intervals) {
        // We have an outdated interval, remove it.
        PopInterval(manager, current);
      }
    } else {
      UpdateCost(manager, i, current->index, current->cost);
    }
    current = next;
  }
}